

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_typed_array_reverse(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  undefined1 uVar1;
  undefined2 uVar2;
  undefined4 uVar3;
  undefined1 *puVar4;
  undefined4 *puVar5;
  undefined8 *puVar6;
  undefined8 uVar7;
  undefined2 *puVar8;
  uint uVar9;
  undefined1 *puVar10;
  undefined4 *puVar11;
  undefined8 *puVar12;
  undefined2 *puVar13;
  undefined1 *puVar14;
  undefined4 *puVar15;
  undefined8 *puVar16;
  undefined2 *puVar17;
  int64_t iVar18;
  JSValueUnion JVar19;
  JSValue JVar20;
  
  iVar18 = this_val.tag;
  JVar19 = this_val.u;
  uVar9 = js_typed_array_get_length_internal(ctx,this_val);
  if ((int)uVar9 < 0) {
    iVar18 = 6;
    JVar19.float64 = 0.0;
  }
  else {
    if (uVar9 != 0) {
      switch("includes"[(ulong)*(ushort *)((long)JVar19.ptr + 6) + 1]) {
      case '\0':
        puVar4 = *(undefined1 **)((long)JVar19.ptr + 0x38);
        puVar10 = puVar4 + ((ulong)uVar9 - 1);
        if (puVar4 < puVar10) {
          do {
            puVar14 = puVar4 + 1;
            uVar1 = *puVar4;
            *puVar4 = *puVar10;
            *puVar10 = uVar1;
            puVar10 = puVar10 + -1;
            puVar4 = puVar14;
          } while (puVar14 < puVar10);
        }
        break;
      case '\x01':
        puVar8 = *(undefined2 **)((long)JVar19.ptr + 0x38);
        puVar13 = puVar8 + ((ulong)uVar9 - 1);
        if (puVar8 < puVar13) {
          do {
            puVar17 = puVar8 + 1;
            uVar2 = *puVar8;
            *puVar8 = *puVar13;
            *puVar13 = uVar2;
            puVar13 = puVar13 + -1;
            puVar8 = puVar17;
          } while (puVar17 < puVar13);
        }
        break;
      case '\x02':
        puVar5 = *(undefined4 **)((long)JVar19.ptr + 0x38);
        puVar11 = puVar5 + ((ulong)uVar9 - 1);
        if (puVar5 < puVar11) {
          do {
            puVar15 = puVar5 + 1;
            uVar3 = *puVar5;
            *puVar5 = *puVar11;
            *puVar11 = uVar3;
            puVar11 = puVar11 + -1;
            puVar5 = puVar15;
          } while (puVar15 < puVar11);
        }
        break;
      case '\x03':
        puVar6 = *(undefined8 **)((long)JVar19.ptr + 0x38);
        puVar12 = puVar6 + ((ulong)uVar9 - 1);
        if (puVar6 < puVar12) {
          do {
            puVar16 = puVar6 + 1;
            uVar7 = *puVar6;
            *puVar6 = *puVar12;
            *puVar12 = uVar7;
            puVar12 = puVar12 + -1;
            puVar6 = puVar16;
          } while (puVar16 < puVar12);
        }
        break;
      default:
        abort();
      }
    }
    if (0xfffffff4 < (uint)this_val.tag) {
      *(int *)JVar19.ptr = *JVar19.ptr + 1;
    }
  }
  JVar20.tag = iVar18;
  JVar20.u.ptr = JVar19.ptr;
  return JVar20;
}

Assistant:

static JSValue js_typed_array_reverse(JSContext *ctx, JSValueConst this_val,
                                      int argc, JSValueConst *argv)
{
    JSObject *p;
    int len;

    len = js_typed_array_get_length_internal(ctx, this_val);
    if (len < 0)
        return JS_EXCEPTION;
    if (len > 0) {
        p = JS_VALUE_GET_OBJ(this_val);
        switch (typed_array_size_log2(p->class_id)) {
        case 0:
            {
                uint8_t *p1 = p->u.array.u.uint8_ptr;
                uint8_t *p2 = p1 + len - 1;
                while (p1 < p2) {
                    uint8_t v = *p1;
                    *p1++ = *p2;
                    *p2-- = v;
                }
            }
            break;
        case 1:
            {
                uint16_t *p1 = p->u.array.u.uint16_ptr;
                uint16_t *p2 = p1 + len - 1;
                while (p1 < p2) {
                    uint16_t v = *p1;
                    *p1++ = *p2;
                    *p2-- = v;
                }
            }
            break;
        case 2:
            {
                uint32_t *p1 = p->u.array.u.uint32_ptr;
                uint32_t *p2 = p1 + len - 1;
                while (p1 < p2) {
                    uint32_t v = *p1;
                    *p1++ = *p2;
                    *p2-- = v;
                }
            }
            break;
        case 3:
            {
                uint64_t *p1 = p->u.array.u.uint64_ptr;
                uint64_t *p2 = p1 + len - 1;
                while (p1 < p2) {
                    uint64_t v = *p1;
                    *p1++ = *p2;
                    *p2-- = v;
                }
            }
            break;
        default:
            abort();
        }
    }
    return JS_DupValue(ctx, this_val);
}